

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::OneofDescriptor::DebugStringWithOptions_abi_cxx11_
          (OneofDescriptor *this,DebugStringOptions *options)

{
  string *in_RDI;
  string *contents;
  DebugStringOptions *in_stack_000004e8;
  string *in_stack_000004f0;
  int in_stack_000004fc;
  OneofDescriptor *in_stack_00000500;
  
  std::__cxx11::string::string((string *)in_RDI);
  DebugString(in_stack_00000500,in_stack_000004fc,in_stack_000004f0,in_stack_000004e8);
  return in_RDI;
}

Assistant:

std::string OneofDescriptor::DebugStringWithOptions(
    const DebugStringOptions& options) const {
  std::string contents;
  DebugString(0, &contents, options);
  return contents;
}